

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_op.hpp
# Opt level: O3

void asio::detail::
     executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
     ::do_complete(void *owner,scheduler_operation *base,error_code *param_3,size_t param_4)

{
  HTTPRequester *pHVar1;
  undefined8 uVar2;
  scheduler_operation *psVar3;
  ptr p;
  ptr local_40;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
  local_28;
  
  *(undefined1 *)((long)&base[1].next_ + 1) = 0;
  uVar2._0_4_ = base[1].task_result_;
  uVar2._4_4_ = *(undefined4 *)&base[1].field_0x14;
  psVar3 = base[2].next_;
  pHVar1 = (HTTPRequester *)base[1].func_;
  local_40.v = base;
  local_40.p = (executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
                *)base;
  ptr::reset(&local_40);
  if (owner != (void *)0x0) {
    local_28.handler_.this = pHVar1;
    local_28.arg1_._0_8_ = uVar2;
    local_28.arg1_._M_cat = (error_category *)psVar3;
    asio_handler_invoke_helpers::
    invoke<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>,tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0>
              (&local_28,(anon_class_8_1_8991fb9c *)base);
  }
  ptr::reset(&local_40);
  return;
}

Assistant:

static void do_complete(void* owner, Operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    executor_op* o(static_cast<executor_op*>(base));
    ptr p = { o->allocator_, o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(o->handler_));
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      asio_handler_invoke_helpers::invoke(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }